

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.h
# Opt level: O3

void __thiscall
SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>::
SomethingOrDouble(SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                  *this,list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *inSome)

{
  (this->SomeValue).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->SomeValue).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->SomeValue).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
  _M_impl._M_node._M_size = 0;
  if (this != (SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
               *)inSome) {
    std::__cxx11::list<GlyphUnicodeMapping,std::allocator<GlyphUnicodeMapping>>::
    _M_assign_dispatch<std::_List_const_iterator<GlyphUnicodeMapping>>
              ((list<GlyphUnicodeMapping,std::allocator<GlyphUnicodeMapping>> *)this,
               (inSome->super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>)
               ._M_impl._M_node.super__List_node_base._M_next,inSome);
  }
  this->IsDouble = false;
  return;
}

Assistant:

SomethingOrDouble(T inSome){SomeValue = inSome;IsDouble = false;}